

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_gains.hpp
# Opt level: O0

void __thiscall ear::OutputGainsT<float>::check_size(OutputGainsT<float> *this,size_t n)

{
  size_type sVar1;
  invalid_argument *this_00;
  allocator<char> local_39;
  string local_38;
  size_type local_18;
  size_t n_local;
  OutputGainsT<float> *this_local;
  
  local_18 = n;
  n_local = (size_t)this;
  sVar1 = std::vector<float,_std::allocator<float>_>::size(this->vec);
  if (sVar1 != local_18) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"incorrect size for output vector",&local_39);
    invalid_argument::invalid_argument(this_00,&local_38);
    __cxa_throw(this_00,&invalid_argument::typeinfo,invalid_argument::~invalid_argument);
  }
  return;
}

Assistant:

virtual void check_size(size_t n) override {
      if (vec.size() != n) {
        throw invalid_argument("incorrect size for output vector");
      }
    }